

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<float,float>(Thread *this,BinopFunc<float,_float> *f)

{
  u8 i;
  long lVar1;
  float fVar2;
  Simd<float,_(unsigned_char)__x04_> SVar3;
  SR result;
  Simd<float,_(unsigned_char)__x04_> lhs;
  Simd<float,_(unsigned_char)__x04_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  float local_38 [4];
  float local_28 [4];
  
  local_28 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  local_38[2] = SVar3.v[2];
  local_38[3] = SVar3.v[3];
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = (*f)(local_38[lVar1],local_28[lVar1]);
    *(float *)((long)&local_48 + lVar1 * 4) = fVar2;
  }
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}